

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_gen.cc
# Opt level: O2

int cbs_str_equal(CBS *cbs,char *str)

{
  size_t __n;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  
  __n = cbs->len;
  sVar3 = strlen(str);
  uVar1 = 0;
  if (__n == sVar3) {
    if (__n == 0) {
      uVar1 = 1;
    }
    else {
      iVar2 = bcmp(cbs->data,str,__n);
      uVar1 = (uint)(iVar2 == 0);
    }
  }
  return uVar1;
}

Assistant:

static int cbs_str_equal(const CBS *cbs, const char *str) {
  return CBS_len(cbs) == strlen(str) &&
         OPENSSL_memcmp(CBS_data(cbs), str, strlen(str)) == 0;
}